

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createSubdivPlane
          (Vec3fa *p0,Vec3fa *dx,Vec3fa *dy,size_t width,size_t height,float tessellationRate,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  value_type vVar11;
  _func_int **pp_Var12;
  reference pvVar13;
  unsigned_long *puVar14;
  Vec3fa *pVVar15;
  long lVar16;
  size_type __n;
  reference pvVar17;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Node *in_RDI;
  ulong in_R8;
  ulong in_R9;
  undefined4 in_XMM0_Da;
  float fVar18;
  long *in_stack_00000008;
  size_t p11;
  size_t p10;
  size_t p01;
  size_t p00;
  size_t i_5;
  size_t x_1;
  size_t y_1;
  size_t i_4;
  Vec3fa p;
  size_t x;
  size_t y;
  Ref<embree::SceneGraph::SubdivMeshNode> mesh;
  size_t i_3;
  size_t i_2;
  Vec3fa *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced;
  void *in_stack_fffffffffffff9b8;
  size_t in_stack_fffffffffffff9c0;
  size_t in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff9e0;
  float local_588;
  float local_580;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  BBox1f in_stack_fffffffffffffaa0;
  ulong local_4b0;
  ulong local_4a8;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined1 local_468 [4];
  float fStack_464;
  float fStack_460;
  ulong local_458;
  ulong local_450;
  undefined1 local_445;
  undefined4 local_444;
  undefined4 local_440;
  undefined4 local_43c;
  undefined4 uStack_438;
  long *local_428;
  _func_int **local_420;
  undefined4 local_414;
  ulong local_410;
  ulong local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  long **local_3d8;
  undefined4 *local_3d0;
  undefined4 *local_3c8;
  undefined4 *local_3c0;
  long **local_3b8;
  ulong local_3a8;
  reference local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  undefined1 *local_388;
  undefined8 *local_380;
  undefined8 *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 *local_350;
  float local_344;
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 *local_328;
  float local_31c;
  undefined8 *local_318;
  long local_310;
  reference local_308;
  long local_300;
  reference local_2f8;
  long local_2f0;
  reference local_2e8;
  _func_int **local_2e0;
  _func_int ***local_2d8;
  _func_int ***local_2d0;
  _func_int ***local_2c8;
  _func_int ***local_2c0;
  _func_int ***local_2b8;
  _func_int ***local_2b0;
  _func_int ***local_2a8;
  _func_int ***local_2a0;
  _func_int ***local_298;
  _func_int ***local_290;
  _func_int ***local_288;
  _func_int ***local_280;
  _func_int ***local_278;
  _func_int ***local_270;
  _func_int ***local_268;
  _func_int ***local_258;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 *local_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 *local_1d8;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 *local_170;
  float local_164;
  undefined8 *local_160;
  float local_154;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  ulong local_c8;
  ulong local_c0;
  Vec3fa *local_b8;
  ulong local_b0;
  ulong local_a8;
  size_t local_a0;
  ulong local_98;
  reference local_90;
  Vec3fa *local_88;
  Vec3fa *local_80;
  Vec3fa *local_78;
  Vec3fa *local_70;
  size_t local_68;
  Vec3fa *local_60;
  reference local_58;
  size_t local_50;
  reference local_48;
  unsigned_long local_40 [2];
  ulong local_30;
  ulong local_28;
  reference local_20;
  size_t local_18;
  _func_int **local_10;
  
  local_414 = in_XMM0_Da;
  local_410 = in_R9;
  local_408 = in_R8;
  local_400 = in_RCX;
  local_3f8 = in_RDX;
  local_3f0 = in_RSI;
  pp_Var12 = (_func_int **)::operator_new(0x1b0);
  local_445 = 1;
  local_3d8 = &local_428;
  local_428 = (long *)*in_stack_00000008;
  if (local_428 != (long *)0x0) {
    (**(code **)(*local_428 + 0x10))();
  }
  local_440 = 0;
  local_444 = 0x3f800000;
  local_3c0 = &local_43c;
  local_3c8 = &local_440;
  local_3d0 = &local_444;
  local_43c = 0;
  uStack_438 = 0x3f800000;
  SubdivMeshNode::SubdivMeshNode
            ((SubdivMeshNode *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
             in_stack_fffffffffffffa90,in_stack_fffffffffffffaa0,
             CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  local_445 = 0;
  local_2d8 = &local_420;
  local_2e0 = pp_Var12;
  local_420 = pp_Var12;
  if (pp_Var12 != (_func_int **)0x0) {
    (**(code **)(*pp_Var12 + 0x10))();
  }
  local_3b8 = &local_428;
  if (local_428 != (long *)0x0) {
    (**(code **)(*local_428 + 0x18))();
  }
  local_270 = &local_420;
  *(undefined4 *)(local_420 + 0x35) = local_414;
  local_278 = &local_420;
  pvVar13 = std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                          *)(local_420 + 0xe),0);
  local_98 = (local_408 + 1) * (local_410 + 1);
  local_3a8 = local_98;
  local_3a0 = pvVar13;
  local_28 = local_98;
  local_20 = pvVar13;
  if (pvVar13->size_alloced < local_98) {
    local_18 = local_98;
    if (pvVar13->size_alloced != 0) {
      local_30 = pvVar13->size_alloced;
      while (local_30 < local_28) {
        local_40[1] = 1;
        local_40[0] = local_30 << 1;
        puVar14 = std::max<unsigned_long>(local_40 + 1,local_40);
        local_30 = *puVar14;
      }
      local_18 = local_30;
    }
  }
  else {
    local_18 = pvVar13->size_alloced;
  }
  local_a0 = local_18;
  uVar10 = local_98;
  if (local_98 < pvVar13->size_active) {
    while (local_a8 = uVar10, local_a8 < pvVar13->size_active) {
      uVar10 = local_a8 + 1;
    }
    pvVar13->size_active = local_98;
  }
  local_90 = pvVar13;
  if (local_18 == pvVar13->size_alloced) {
    for (local_b0 = pvVar13->size_active; local_b0 < local_98; local_b0 = local_b0 + 1) {
      local_88 = pvVar13->items + local_b0;
    }
    pvVar13->size_active = local_98;
  }
  else {
    local_b8 = pvVar13->items;
    local_50 = local_18;
    local_48 = pvVar13;
    pVVar15 = (Vec3fa *)alignedMalloc(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
    pvVar13->items = pVVar15;
    for (local_c0 = 0; local_c0 < pvVar13->size_active; local_c0 = local_c0 + 1) {
      local_70 = pvVar13->items + local_c0;
      local_78 = local_b8 + local_c0;
      uVar1 = *(undefined8 *)((long)&local_78->field_0 + 8);
      *(undefined8 *)&local_70->field_0 = *(undefined8 *)&local_78->field_0;
      *(undefined8 *)((long)&local_70->field_0 + 8) = uVar1;
    }
    for (local_c8 = pvVar13->size_active; local_c8 < local_98; local_c8 = local_c8 + 1) {
      local_80 = pvVar13->items + local_c8;
    }
    local_68 = pvVar13->size_alloced;
    local_60 = local_b8;
    local_58 = pvVar13;
    alignedFree(in_stack_fffffffffffff9b8);
    pvVar13->size_active = local_98;
    pvVar13->size_alloced = local_a0;
  }
  local_280 = &local_420;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (in_stack_fffffffffffff9e0,CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8)
            );
  local_288 = &local_420;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (in_stack_fffffffffffff9e0,CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8)
            );
  for (local_450 = 0; local_450 <= local_410; local_450 = local_450 + 1) {
    for (local_458 = 0; local_458 <= local_408; local_458 = local_458 + 1) {
      local_31c = (float)local_458 / (float)local_408;
      local_318 = &local_488;
      local_328 = local_3f8;
      local_160 = &local_338;
      local_118 = CONCAT44(local_31c,local_31c);
      uStack_110 = CONCAT44(local_31c,local_31c);
      local_1c0 = &local_488;
      local_1c8 = &local_338;
      local_1d0 = local_3f8;
      uVar1 = *local_3f8;
      uVar2 = local_3f8[1];
      local_128._0_4_ = (float)uVar1;
      local_128._4_4_ = (float)((ulong)uVar1 >> 0x20);
      uStack_120._0_4_ = (float)uVar2;
      uStack_120._4_4_ = (float)((ulong)uVar2 >> 0x20);
      local_1b8 = local_31c * (float)local_128;
      fStack_1b4 = local_31c * local_128._4_4_;
      fStack_1b0 = local_31c * (float)uStack_120;
      fStack_1ac = local_31c * uStack_120._4_4_;
      local_1a8 = &local_488;
      local_248 = CONCAT44(fStack_1b4,local_1b8);
      uStack_240 = CONCAT44(fStack_1ac,fStack_1b0);
      local_370 = &local_478;
      local_380 = &local_488;
      uVar3 = *local_3f0;
      uVar4 = local_3f0[1];
      local_238._0_4_ = (float)uVar3;
      local_238._4_4_ = (float)((ulong)uVar3 >> 0x20);
      uStack_230._0_4_ = (float)uVar4;
      uStack_230._4_4_ = (float)((ulong)uVar4 >> 0x20);
      local_208 = (float)local_238 + local_1b8;
      fStack_204 = local_238._4_4_ + fStack_1b4;
      fStack_200 = (float)uStack_230 + fStack_1b0;
      fStack_1fc = uStack_230._4_4_ + fStack_1ac;
      local_1f0 = &local_478;
      local_218 = CONCAT44(fStack_204,local_208);
      uStack_210 = CONCAT44(fStack_1fc,fStack_200);
      local_580 = (float)local_450;
      local_588 = (float)local_410;
      local_344 = local_580 / local_588;
      local_340 = &local_498;
      local_350 = local_400;
      local_150 = &local_368;
      local_138 = CONCAT44(local_344,local_344);
      uStack_130 = CONCAT44(local_344,local_344);
      local_190 = &local_498;
      local_198 = &local_368;
      local_1a0 = local_400;
      uVar5 = *local_400;
      uVar6 = local_400[1];
      local_148._0_4_ = (float)uVar5;
      local_148._4_4_ = (float)((ulong)uVar5 >> 0x20);
      uStack_140._0_4_ = (float)uVar6;
      uStack_140._4_4_ = (float)((ulong)uVar6 >> 0x20);
      local_188 = local_344 * (float)local_148;
      fStack_184 = local_344 * local_148._4_4_;
      fStack_180 = local_344 * (float)uStack_140;
      fStack_17c = local_344 * uStack_140._4_4_;
      local_170 = &local_498;
      local_228 = CONCAT44(fStack_184,local_188);
      uStack_220 = CONCAT44(fStack_17c,fStack_180);
      local_388 = local_468;
      local_390 = &local_478;
      local_398 = &local_498;
      fVar18 = local_208 + local_188;
      fStack_464 = fStack_204 + fStack_184;
      fStack_460 = fStack_200 + fStack_180;
      fStack_1dc = fStack_1fc + fStack_17c;
      local_1d8 = local_468;
      lVar16 = local_450 * (local_408 + 1) + local_458;
      local_290 = &local_420;
      local_238 = uVar3;
      uStack_230 = uVar4;
      local_1e8 = fVar18;
      fStack_1e4 = fStack_464;
      fStack_1e0 = fStack_460;
      local_164 = local_31c;
      local_154 = local_344;
      local_148 = uVar5;
      uStack_140 = uVar6;
      local_128 = uVar1;
      uStack_120 = uVar2;
      local_108 = local_344;
      fStack_104 = local_344;
      fStack_100 = local_344;
      fStack_fc = local_344;
      local_f8 = local_344;
      local_e8 = local_31c;
      fStack_e4 = local_31c;
      fStack_e0 = local_31c;
      fStack_dc = local_31c;
      local_d8 = local_31c;
      local_498 = local_228;
      uStack_490 = uStack_220;
      local_488 = local_248;
      uStack_480 = uStack_240;
      local_478 = local_218;
      uStack_470 = uStack_210;
      local_368 = local_138;
      uStack_360 = uStack_130;
      local_338 = local_118;
      uStack_330 = uStack_110;
      local_2e8 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_420 + 0xe),0);
      local_2e8->items[lVar16].field_0.m128[0] = fVar18;
      local_298 = &local_420;
      local_2f0 = lVar16;
      local_2f8 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_420 + 0xe),0);
      local_2f8->items[lVar16].field_0.m128[1] = fStack_464;
      local_2a0 = &local_420;
      local_300 = lVar16;
      local_308 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_420 + 0xe),0);
      local_308->items[lVar16].field_0.m128[2] = fStack_460;
      local_310 = lVar16;
    }
  }
  for (local_4a8 = 0; local_4a8 < local_410; local_4a8 = local_4a8 + 1) {
    for (local_4b0 = 0; local_4b0 < local_408; local_4b0 = local_4b0 + 1) {
      __n = local_4a8 * local_408 + local_4b0;
      iVar9 = (int)local_408;
      iVar8 = (int)local_4a8;
      iVar7 = (int)local_4b0;
      vVar11 = (iVar8 + 1) * (iVar9 + 1) + iVar7;
      local_2a8 = &local_420;
      pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_420 + 0x17)
                           ,__n * 4);
      *pvVar17 = iVar8 * (iVar9 + 1) + iVar7;
      local_2b0 = &local_420;
      pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_420 + 0x17)
                           ,__n * 4 + 1);
      *pvVar17 = iVar8 * (iVar9 + 1) + iVar7 + 1;
      local_2b8 = &local_420;
      pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_420 + 0x17)
                           ,__n * 4 + 2);
      *pvVar17 = (iVar8 + 1) * (iVar9 + 1) + iVar7 + 1;
      local_2c0 = &local_420;
      pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_420 + 0x17)
                           ,__n * 4 + 3);
      *pvVar17 = vVar11;
      local_2c8 = &local_420;
      pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_420 + 0x22)
                           ,__n);
      *pvVar17 = 4;
    }
  }
  local_2d0 = &local_420;
  *(undefined4 *)(local_420 + 0x20) = 2;
  local_268 = &local_420;
  local_10 = local_420;
  (in_RDI->super_RefCount)._vptr_RefCount = local_420;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_258 = &local_420;
  if (local_420 != (_func_int **)0x0) {
    (**(code **)(*local_420 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createSubdivPlane (const Vec3fa& p0, const Vec3fa& dx, const Vec3fa& dy, size_t width, size_t height, float tessellationRate, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::SubdivMeshNode> mesh = new SceneGraph::SubdivMeshNode(material,BBox1f(0,1),1);
    mesh->tessellationRate = tessellationRate;
    mesh->positions[0].resize((width+1)*(height+1));
    mesh->position_indices.resize(4*width*height);
    mesh->verticesPerFace.resize(width*height);

    for (size_t y=0; y<=height; y++) {
      for (size_t x=0; x<=width; x++) {
        Vec3fa p = p0+float(x)/float(width)*dx+float(y)/float(height)*dy;
        size_t i = y*(width+1)+x;
        mesh->positions[0][i].x = p.x;
        mesh->positions[0][i].y = p.y;
        mesh->positions[0][i].z = p.z;
      }
    }
    for (size_t y=0; y<height; y++) {
      for (size_t x=0; x<width; x++) {
        size_t i = y*width+x;
        size_t p00 = (y+0)*(width+1)+(x+0);
        size_t p01 = (y+0)*(width+1)+(x+1);
        size_t p10 = (y+1)*(width+1)+(x+0);
        size_t p11 = (y+1)*(width+1)+(x+1);
        mesh->position_indices[4*i+0] = unsigned(p00); 
        mesh->position_indices[4*i+1] = unsigned(p01); 
        mesh->position_indices[4*i+2] = unsigned(p11); 
        mesh->position_indices[4*i+3] = unsigned(p10);
        mesh->verticesPerFace[i] = 4;
      }
    }
    mesh->position_subdiv_mode = RTC_SUBDIVISION_MODE_PIN_CORNERS;
    return mesh.dynamicCast<SceneGraph::Node>();
  }